

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::detail::ParserRefImpl<Catch::clara::detail::Arg>::
ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (ParserRefImpl<Catch::clara::detail::Arg> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ref,string *hint)

{
  string *in_RDX;
  undefined8 *in_RDI;
  shared_ptr<Catch::clara::detail::BoundValueRef<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  ComposableParserImpl<Catch::clara::detail::Arg> *in_stack_ffffffffffffffb0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffd8;
  
  ComposableParserImpl<Catch::clara::detail::Arg>::ComposableParserImpl(in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__ParserRefImpl_004d4ff8;
  *(undefined4 *)(in_RDI + 1) = 0;
  ::std::
  make_shared<Catch::clara::detail::BoundValueRef<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            (in_stack_ffffffffffffffd8);
  ::std::shared_ptr<Catch::clara::detail::BoundRef>::
  shared_ptr<Catch::clara::detail::BoundValueRef<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((shared_ptr<Catch::clara::detail::BoundRef> *)&stack0xffffffffffffffd8,
             in_stack_ffffffffffffffa8);
  std::
  shared_ptr<Catch::clara::detail::BoundValueRef<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~shared_ptr((shared_ptr<Catch::clara::detail::BoundValueRef<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)0x34b510);
  ::std::__cxx11::string::string((string *)(in_RDI + 4),in_RDX);
  ::std::__cxx11::string::string((string *)(in_RDI + 8));
  return;
}

Assistant:

ParserRefImpl( T &ref, std::string const &hint )
        :   m_ref( std::make_shared<BoundValueRef<T>>( ref ) ),
            m_hint( hint )
        {}